

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

FloatParts round_to_int(FloatParts a,int rmode,int scale,float_status *s)

{
  FloatParts FVar1;
  FloatParts FVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  bool bVar13;
  FloatParts FVar14;
  
  uVar10 = a._8_8_;
  uVar6 = a.frac;
  switch(a._12_4_ & 0xff) {
  case 1:
  case 3:
    return a;
  case 2:
    break;
  case 4:
  case 5:
    FVar14 = return_nan(a,s);
    return FVar14;
  default:
    iVar3 = 0x839;
    goto LAB_00cfcb3a;
  }
  iVar3 = -0x10000;
  if (-0x10000 < scale) {
    iVar3 = scale;
  }
  if (0xffff < iVar3) {
    iVar3 = 0x10000;
  }
  uVar7 = a.exp + iVar3;
  uVar8 = uVar10 & 0xffffffff00000000;
  uVar11 = uVar8 + uVar7;
  if (0x3d < (int)uVar7) goto LAB_00cfc9fa;
  uVar4 = 0x4000000000000000;
  FVar2.exp = (int)uVar8;
  FVar2.cls = (char)(uVar8 >> 0x20);
  FVar2.sign = (_Bool)(char)(uVar8 >> 0x28);
  FVar2._14_2_ = (short)(uVar8 >> 0x30);
  FVar2.frac = 0x4000000000000000;
  FVar14.exp = (int)uVar8;
  FVar14.cls = (char)(uVar8 >> 0x20);
  FVar14.sign = (_Bool)(char)(uVar8 >> 0x28);
  FVar14._14_2_ = (short)(uVar8 >> 0x30);
  FVar14.frac = 0x4000000000000000;
  if (-1 < (int)uVar7) {
    uVar5 = 0x4000000000000000 >> ((byte)uVar7 & 0x3f);
    uVar4 = 0x2000000000000000 >> ((byte)uVar7 & 0x3f);
    if (5 < (uint)rmode) {
      iVar3 = 0x829;
      goto LAB_00cfcb3a;
    }
    uVar12 = uVar5 - 1 | uVar5;
    uVar9 = uVar12 >> 1;
    switch(rmode) {
    case 0:
      if ((uVar12 & uVar6) == uVar4) {
        uVar4 = 0;
      }
      break;
    case 1:
      uVar4 = (long)(uVar10 << 0x17) >> 0x3f & uVar9;
      break;
    case 2:
      uVar4 = 0;
      if ((uVar10 >> 0x28 & 1) == 0) {
        uVar4 = uVar9;
      }
      break;
    case 3:
      uVar4 = 0;
      break;
    case 5:
      uVar4 = 0;
      if ((uVar5 & uVar6) == 0) {
        uVar4 = uVar9;
      }
    }
    if ((uVar9 & uVar6) != 0) {
      s->float_exception_flags = s->float_exception_flags | 0x20;
      uVar4 = uVar4 + uVar6;
      uVar6 = ~uVar9 & uVar4;
      if ((long)uVar4 < 0) {
        FVar1._8_8_ = uVar8 + uVar7 + 1;
        FVar1.frac = uVar6 >> 1;
        return FVar1;
      }
    }
    goto LAB_00cfc9fa;
  }
  s->float_exception_flags = s->float_exception_flags | 0x20;
  switch(rmode) {
  case 0:
    bVar13 = uVar6 == 0x4000000000000000;
    goto LAB_00cfcb07;
  case 1:
    bVar13 = (bool)(a.sign & 1);
    break;
  case 2:
    bVar13 = (uVar10 >> 0x28 & 1) == 0;
    break;
  case 3:
    goto switchD_00cfca7a_caseD_3;
  case 4:
    uVar4 = 0x3fffffffffffffff;
    bVar13 = uVar6 == 0x3fffffffffffffff;
LAB_00cfcb07:
    bVar13 = (uVar4 <= uVar6 && !bVar13) && uVar7 == 0xffffffff;
    break;
  case 5:
    goto switchD_00cfca7a_caseD_5;
  default:
    iVar3 = 0x804;
LAB_00cfcb3a:
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/fpu/softfloat.c"
               ,iVar3,(char *)0x0);
  }
  FVar14 = FVar2;
  if (bVar13 == false) {
switchD_00cfca7a_caseD_3:
    uVar11 = uVar11 & 0xffffff00ffffffff | 0x100000000;
LAB_00cfc9fa:
    FVar14.exp = (int)uVar11;
    FVar14.cls = (char)(uVar11 >> 0x20);
    FVar14.sign = (_Bool)(char)(uVar11 >> 0x28);
    FVar14._14_2_ = (short)(uVar11 >> 0x30);
    FVar14.frac = uVar6;
  }
switchD_00cfca7a_caseD_5:
  return FVar14;
}

Assistant:

static FloatParts round_to_int(FloatParts a, int rmode,
                               int scale, float_status *s)
{
    switch (a.cls) {
    case float_class_qnan:
    case float_class_snan:
        return return_nan(a, s);

    case float_class_zero:
    case float_class_inf:
        /* already "integral" */
        break;

    case float_class_normal:
        scale = MIN(MAX(scale, -0x10000), 0x10000);
        a.exp += scale;

        if (a.exp >= DECOMPOSED_BINARY_POINT) {
            /* already integral */
            break;
        }
        if (a.exp < 0) {
            bool one = false;
            /* all fractional */
            s->float_exception_flags |= float_flag_inexact;
            switch (rmode) {
            case float_round_nearest_even:
                one = a.exp == -1 && a.frac > DECOMPOSED_IMPLICIT_BIT;
                break;
            case float_round_ties_away:
                one = a.exp == -1 && a.frac >= DECOMPOSED_IMPLICIT_BIT;
                break;
            case float_round_to_zero:
                one = false;
                break;
            case float_round_up:
                one = !a.sign;
                break;
            case float_round_down:
                one = a.sign;
                break;
            case float_round_to_odd:
                one = true;
                break;
            default:
                g_assert_not_reached();
                break;
            }

            if (one) {
                a.frac = DECOMPOSED_IMPLICIT_BIT;
                a.exp = 0;
            } else {
                a.cls = float_class_zero;
            }
        } else {
            uint64_t frac_lsb = DECOMPOSED_IMPLICIT_BIT >> a.exp;
            uint64_t frac_lsbm1 = frac_lsb >> 1;
            uint64_t rnd_even_mask = (frac_lsb - 1) | frac_lsb;
            uint64_t rnd_mask = rnd_even_mask >> 1;
            uint64_t inc = 0;

            switch (rmode) {
            case float_round_nearest_even:
                inc = ((a.frac & rnd_even_mask) != frac_lsbm1 ? frac_lsbm1 : 0);
                break;
            case float_round_ties_away:
                inc = frac_lsbm1;
                break;
            case float_round_to_zero:
                inc = 0;
                break;
            case float_round_up:
                inc = a.sign ? 0 : rnd_mask;
                break;
            case float_round_down:
                inc = a.sign ? rnd_mask : 0;
                break;
            case float_round_to_odd:
                inc = a.frac & frac_lsb ? 0 : rnd_mask;
                break;
            default:
                g_assert_not_reached();
                break;
            }

            if (a.frac & rnd_mask) {
                s->float_exception_flags |= float_flag_inexact;
                a.frac += inc;
                a.frac &= ~rnd_mask;
                if (a.frac & DECOMPOSED_OVERFLOW_BIT) {
                    a.frac >>= 1;
                    a.exp++;
                }
            }
        }
        break;
    default:
        g_assert_not_reached();
    }
    return a;
}